

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-invert-images.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ImageInverter *this;
  long lVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  undefined8 extraout_RAX;
  long *plVar8;
  char *pcVar9;
  int extraout_EDX;
  allocator<char> local_131;
  QPDF qpdf;
  QPDFWriter w;
  _Rb_tree_node_base local_110;
  char *local_e8;
  long local_e0;
  ImageInverter *local_d8;
  long local_d0;
  QPDFObjectHandle color_space;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p;
  long local_a8;
  long local_a0;
  __shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_80;
  QPDFObjectHandle bits_per_component;
  QPDFObjectHandle image_dict;
  string local_50 [32];
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if ((argc < 2) || (iVar4 = strcmp(argv[1]," --static-id"), iVar4 != 0)) {
    bVar2 = false;
  }
  else {
    argv = argv + 1;
    argc = argc + -1;
    bVar2 = true;
  }
  if (1 < argc - 3U) {
    usage();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.
                super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    QPDF::~QPDF(&qpdf);
    if (extraout_EDX == 1) {
      plVar8 = (long *)__cxa_begin_catch(extraout_RAX);
      poVar7 = std::operator<<((ostream *)&std::cerr,whoami);
      poVar7 = std::operator<<(poVar7," processing file ");
      poVar7 = std::operator<<(poVar7,local_e8);
      poVar7 = std::operator<<(poVar7,": ");
      pcVar9 = (char *)(**(code **)(*plVar8 + 0x10))(plVar8);
      poVar7 = std::operator<<(poVar7,pcVar9);
      std::endl<char,std::char_traits<char>>(poVar7);
      exit(2);
    }
    _Unwind_Resume(extraout_RAX);
  }
  pcVar9 = argv[1];
  pcVar1 = argv[2];
  local_e8 = pcVar9;
  QPDF::QPDF(&qpdf);
  QPDF::processFile((char *)&qpdf,pcVar9);
  this = (ImageInverter *)operator_new(0x40);
  ImageInverter::ImageInverter(this);
  std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<ImageInverter,void>
            ((__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2> *)&p,
             this);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w,&qpdf);
  local_d8 = this;
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w);
  local_e0 = local_a0;
  while (local_a8 != local_e0) {
    local_d0 = local_a8;
    QPDFPageObjectHelper::getImages_abi_cxx11_();
    for (p_Var6 = local_110._M_left; p_Var6 != &local_110;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      QPDFObjectHandle::getDict();
      std::__cxx11::string::string<std::allocator<char>>
                (local_50,"/ColorSpace",(allocator<char> *)&bits_per_component);
      QPDFObjectHandle::getKey((string *)&color_space);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::string<std::allocator<char>>(local_50,"/BitsPerComponent",&local_131);
      QPDFObjectHandle::getKey((string *)&bits_per_component);
      std::__cxx11::string::~string(local_50);
      cVar3 = QPDFObjectHandle::pipeStreamData
                        ((Pipeline *)(p_Var6 + 2),0,qpdf_dl_generalized,true,false);
      if (cVar3 != '\0') {
        std::__cxx11::string::string<std::allocator<char>>(local_50,"/DeviceGray",&local_131);
        cVar3 = QPDFObjectHandle::isNameAndEquals((string *)&color_space);
        if ((cVar3 == '\0') || (cVar3 = QPDFObjectHandle::isInteger(), cVar3 == '\0')) {
          std::__cxx11::string::~string(local_50);
        }
        else {
          lVar5 = QPDFObjectHandle::getIntValue();
          std::__cxx11::string::~string(local_50);
          if (lVar5 == 8) {
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_80,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(p_Var6 + 2));
            std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr(&local_90,
                         &p.
                          super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                        );
            ImageInverter::registerImage
                      (local_d8,(QPDFObjectHandle *)&local_80,
                       (shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&local_90);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
          }
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&bits_per_component.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&color_space.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&image_dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                 *)&w);
    local_a8 = local_d0 + 0x38;
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_a8);
  QPDFWriter::QPDFWriter(&w,&qpdf,pcVar1);
  if (bVar2) {
    QPDFWriter::setStaticID(SUB81(&w,0));
  }
  QPDFWriter::write();
  poVar7 = std::operator<<((ostream *)&std::cout,whoami);
  poVar7 = std::operator<<(poVar7,": new file written to ");
  poVar7 = std::operator<<(poVar7,pcVar1);
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  QPDF::~QPDF(&qpdf);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    // For test suite
    bool static_id = false;
    if ((argc > 1) && (strcmp(argv[1], " --static-id") == 0)) {
        static_id = true;
        --argc;
        ++argv;
    }

    if (!((argc == 3) || (argc == 4))) {
        usage();
    }

    char const* infilename = argv[1];
    char const* outfilename = argv[2];
    char const* password = (argc == 4) ? argv[3] : "";

    try {
        QPDF qpdf;
        qpdf.processFile(infilename, password);

        auto* inv = new ImageInverter;
        auto p = std::shared_ptr<QPDFObjectHandle::StreamDataProvider>(inv);

        // For each page...
        for (auto& page: QPDFPageDocumentHelper(qpdf).getAllPages()) {
            // Get all images on the page.
            for (auto& iter: page.getImages()) {
                QPDFObjectHandle& image = iter.second;
                QPDFObjectHandle image_dict = image.getDict();
                QPDFObjectHandle color_space = image_dict.getKey("/ColorSpace");
                QPDFObjectHandle bits_per_component = image_dict.getKey("/BitsPerComponent");

                // For our example, we can only work with 8-bit grayscale images that we can fully
                // decode.  Use pipeStreamData with a null pipeline to determine whether the image
                // is filterable.  Directly inspect keys to determine the image type.
                if (image.pipeStreamData(nullptr, qpdf_ef_compress, qpdf_dl_all) &&
                    color_space.isNameAndEquals("/DeviceGray") && bits_per_component.isInteger() &&
                    (bits_per_component.getIntValue() == 8)) {
                    inv->registerImage(image, p);
                }
            }
        }

        // Write out a new file
        QPDFWriter w(qpdf, outfilename);
        if (static_id) {
            // For the test suite, uncompress streams and use static IDs.
            w.setStaticID(true); // for testing only
        }
        w.write();
        std::cout << whoami << ": new file written to " << outfilename << std::endl;
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << infilename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}